

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

shared_ptr<minja::Expression> __thiscall minja::Parser::parseBracedExpressionOrArray(Parser *this)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  runtime_error *prVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  element_type *in_RDI;
  shared_ptr<minja::Expression> sVar7;
  shared_ptr<minja::Expression> next;
  vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
  tuple;
  shared_ptr<minja::Expression> expr;
  shared_ptr<minja::ArrayExpr> *in_stack_fffffffffffffdd8;
  vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
  *in_stack_fffffffffffffde0;
  undefined7 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdef;
  vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
  *in_stack_fffffffffffffdf0;
  vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
  *this_00;
  vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
  *in_stack_fffffffffffffe00;
  undefined7 in_stack_fffffffffffffe08;
  allocator<char> *in_stack_fffffffffffffe10;
  allocator<char> *__a;
  char *in_stack_fffffffffffffe18;
  char *__s;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  Parser *this_01;
  SpaceHandling in_stack_fffffffffffffe7c;
  string *in_stack_fffffffffffffe80;
  Parser *in_stack_fffffffffffffe88;
  string local_170 [23];
  undefined1 in_stack_fffffffffffffea7;
  Parser *in_stack_fffffffffffffea8;
  string local_150 [32];
  __shared_ptr local_130 [23];
  allocator<char> local_119;
  string local_118 [32];
  string local_f8 [32];
  char local_d8 [24];
  uint local_c0;
  undefined1 local_b9 [33];
  string local_98 [32];
  __shared_ptr local_78 [39];
  allocator<char> local_51;
  string local_50 [32];
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),in_stack_fffffffffffffe18
             ,in_stack_fffffffffffffe10);
  consumeToken(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  if ((bVar1 & 1) == 0) {
    parseExpression(in_stack_fffffffffffffea8,(bool)in_stack_fffffffffffffea7);
    bVar2 = std::__shared_ptr::operator_cast_to_bool(local_78);
    if (!bVar2) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"Expected expression in braced expression");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_01 = (Parser *)local_b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
               in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    consumeToken(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
    bVar1 = std::__cxx11::string::empty();
    bVar1 = bVar1 ^ 0xff;
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string((string *)(local_b9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_b9);
    if ((bVar1 & 1) == 0) {
      __s = local_d8;
      std::
      vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
      ::vector((vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
                *)0x3001d6);
      std::
      vector<std::shared_ptr<minja::Expression>,std::allocator<std::shared_ptr<minja::Expression>>>
      ::emplace_back<std::shared_ptr<minja::Expression>>
                (in_stack_fffffffffffffdf0,
                 (shared_ptr<minja::Expression> *)
                 CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
      do {
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffde0,
                           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffdd8);
        if (!bVar2) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar5,"Expected closing parenthesis");
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        __a = &local_119;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(bVar1,in_stack_fffffffffffffe20),__s,__a);
        consumeToken(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
        bVar3 = std::__cxx11::string::empty();
        std::__cxx11::string::~string(local_f8);
        std::__cxx11::string::~string(local_118);
        std::allocator<char>::~allocator(&local_119);
        if ((bVar3 & 1) != 0) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar5,"Expected comma in tuple");
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        parseExpression(in_stack_fffffffffffffea8,(bool)in_stack_fffffffffffffea7);
        bVar2 = std::__shared_ptr::operator_cast_to_bool(local_130);
        if (!bVar2) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar5,"Expected expression in tuple");
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::
        vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
        ::push_back(in_stack_fffffffffffffde0,(value_type *)in_stack_fffffffffffffdd8);
        this_00 = (vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
                   *)&stack0xfffffffffffffe8f;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(bVar1,in_stack_fffffffffffffe20),__s,__a);
        consumeToken(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
        bVar4 = std::__cxx11::string::empty();
        bVar4 = bVar4 ^ 0xff;
        std::__cxx11::string::~string(local_150);
        std::__cxx11::string::~string(local_170);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe8f);
        bVar2 = (bVar4 & 1) != 0;
        if (bVar2) {
          get_location(this_01);
          std::
          make_shared<minja::ArrayExpr,minja::Location,std::vector<std::shared_ptr<minja::Expression>,std::allocator<std::shared_ptr<minja::Expression>>>>
                    ((Location *)CONCAT17(bVar3,in_stack_fffffffffffffe08),in_stack_fffffffffffffe00
                    );
          std::shared_ptr<minja::Expression>::shared_ptr<minja::ArrayExpr,void>
                    ((shared_ptr<minja::Expression> *)in_stack_fffffffffffffde0,
                     in_stack_fffffffffffffdd8);
          std::shared_ptr<minja::ArrayExpr>::~shared_ptr((shared_ptr<minja::ArrayExpr> *)0x300506);
          Location::~Location((Location *)0x300513);
        }
        local_c0 = (uint)bVar2;
        std::shared_ptr<minja::Expression>::~shared_ptr((shared_ptr<minja::Expression> *)0x3005a1);
      } while (local_c0 == 0);
      std::
      vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
      ::~vector(this_00);
    }
    else {
      std::shared_ptr<minja::Expression>::shared_ptr
                ((shared_ptr<minja::Expression> *)in_stack_fffffffffffffde0,
                 (shared_ptr<minja::Expression> *)in_stack_fffffffffffffdd8);
      local_c0 = 1;
    }
    std::shared_ptr<minja::Expression>::~shared_ptr((shared_ptr<minja::Expression> *)0x30064a);
    _Var6._M_pi = extraout_RDX_00;
  }
  else {
    std::shared_ptr<minja::Expression>::shared_ptr
              ((shared_ptr<minja::Expression> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8)
    ;
    _Var6._M_pi = extraout_RDX;
  }
  sVar7.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  sVar7.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<minja::Expression>)
         sVar7.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expression> parseBracedExpressionOrArray() {
        if (consumeToken("(").empty()) return nullptr;

        auto expr = parseExpression();
        if (!expr) throw std::runtime_error("Expected expression in braced expression");

        if (!consumeToken(")").empty()) {
            return expr;  // Drop the parentheses
        }

        std::vector<std::shared_ptr<Expression>> tuple;
        tuple.emplace_back(std::move(expr));

        while (it != end) {
          if (consumeToken(",").empty()) throw std::runtime_error("Expected comma in tuple");
          auto next = parseExpression();
          if (!next) throw std::runtime_error("Expected expression in tuple");
          tuple.push_back(std::move(next));

          if (!consumeToken(")").empty()) {
              return std::make_shared<ArrayExpr>(get_location(), std::move(tuple));
          }
        }
        throw std::runtime_error("Expected closing parenthesis");
    }